

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateString(Tables *this,string *value)

{
  pointer *ppuVar1;
  pointer pcVar2;
  iterator __position;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  string *result;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (pbVar3->_M_dataplus)._M_p = (pointer)&pbVar3->field_2;
  pcVar2 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pbVar3,pcVar2,pcVar2 + value->_M_string_length);
  __position._M_current =
       (this->strings_).
       super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_20._M_head_impl = pbVar3;
  if (__position._M_current ==
      (this->strings_).
      super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::allocator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>
    ::_M_realloc_insert<std::__cxx11::string*&>
              ((vector<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::allocator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>
                *)&this->strings_,__position,&local_20._M_head_impl);
  }
  else {
    ((__position._M_current)->_M_t).
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl = pbVar3;
    ppuVar1 = &(this->strings_).
               super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return local_20._M_head_impl;
}

Assistant:

std::string* DescriptorPool::Tables::AllocateString(const std::string& value) {
  std::string* result = new std::string(value);
  strings_.emplace_back(result);
  return result;
}